

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O2

void __thiscall xercesc_4_0::OpFactory::OpFactory(OpFactory *this,MemoryManager *manager)

{
  RefVectorOf<xercesc_4_0::Op> *this_00;
  
  this->fOpVector = (RefVectorOf<xercesc_4_0::Op> *)0x0;
  this->fMemoryManager = manager;
  this_00 = (RefVectorOf<xercesc_4_0::Op> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::Op>::RefVectorOf(this_00,0x10,true,this->fMemoryManager);
  this->fOpVector = this_00;
  return;
}

Assistant:

OpFactory::OpFactory(MemoryManager* const manager) :
    fOpVector(0)
    , fMemoryManager(manager)
{
    fOpVector = new (fMemoryManager) RefVectorOf<Op>(16, true, fMemoryManager);
}